

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<ArgumentData,_4U>::~SmallArray(SmallArray<ArgumentData,_4U> *this)

{
  ArgumentData *pAVar1;
  
  pAVar1 = this->data;
  if (pAVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pAVar1 != (ArgumentData *)0x0) {
        (*(code *)NULLC::dealloc)(pAVar1);
      }
    }
    else if (pAVar1 != (ArgumentData *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}